

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O0

int Ssw_ManSweep(Ssw_Man_t *p)

{
  FILE *pFVar1;
  Bar_Progress_t *pBVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Aig_Man_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  abctime aVar9;
  Vec_Int_t *local_c0;
  Vec_Int_t *local_50;
  Vec_Int_t *vObjPairs;
  abctime clk;
  int local_38;
  int f;
  int i;
  int nConstrPairs;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Bar_Progress_t *pProgress;
  Ssw_Man_t *p_local;
  
  pObj = (Aig_Obj_t *)0x0;
  pProgress = (Bar_Progress_t *)p;
  vObjPairs = (Vec_Int_t *)Abc_Clock();
  pAVar6 = Ssw_FramesWithClasses((Ssw_Man_t *)pProgress);
  *(Aig_Man_t **)(pProgress + 1) = pAVar6;
  iVar3 = Aig_ManCoNum(*(Aig_Man_t **)(pProgress + 1));
  iVar4 = Aig_ManRegNum((Aig_Man_t *)pProgress->pFile);
  f = iVar3 - iVar4;
  if ((f & 1U) == 0) {
    for (local_38 = 0; local_38 < f; local_38 = local_38 + 2) {
      pObj2 = Aig_ManCo(*(Aig_Man_t **)(pProgress + 1),local_38);
      pObjNew = Aig_ManCo(*(Aig_Man_t **)(pProgress + 1),local_38 + 1);
      pBVar2 = pProgress;
      pAVar7 = Aig_ObjChild0(pObj2);
      pAVar8 = Aig_ObjChild0(pObjNew);
      Ssw_NodesAreConstrained((Ssw_Man_t *)pBVar2,pAVar7,pAVar8);
    }
    for (local_38 = 0; iVar3 = local_38, iVar4 = Aig_ManRegNum((Aig_Man_t *)pProgress->pFile),
        iVar3 < iVar4; local_38 = local_38 + 1) {
      pObj2 = Aig_ManCo(*(Aig_Man_t **)(pProgress + 1),f + local_38);
      pFVar1 = pProgress[2].pFile;
      pAVar7 = Aig_ObjFanin0(pObj2);
      Ssw_CnfNodeAddToSolver((Ssw_Sat_t *)pFVar1,pAVar7);
    }
    sat_solver_simplify((sat_solver *)(pProgress[2].pFile)->_IO_read_end);
    pBVar2 = pProgress;
    clk._4_4_ = *(int *)(*(long *)pProgress + 8);
    pAVar7 = Aig_ManConst1((Aig_Man_t *)pProgress->pFile);
    iVar3 = clk._4_4_;
    pAVar8 = Aig_ManConst1(*(Aig_Man_t **)(pProgress + 1));
    Ssw_ObjSetFrame((Ssw_Man_t *)pBVar2,pAVar7,iVar3,pAVar8);
    for (local_38 = 0; iVar3 = local_38, iVar4 = Saig_ManPiNum((Aig_Man_t *)pProgress->pFile),
        iVar3 < iVar4; local_38 = local_38 + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pProgress->pFile->_IO_read_end,local_38);
      pBVar2 = pProgress;
      iVar3 = clk._4_4_;
      pObj2 = pAVar7;
      pAVar8 = Aig_ObjCreateCi(*(Aig_Man_t **)(pProgress + 1));
      Ssw_ObjSetFrame((Ssw_Man_t *)pBVar2,pAVar7,iVar3,pAVar8);
    }
    aVar9 = Abc_Clock();
    pProgress[0xe].pFile = (FILE *)((aVar9 - (long)vObjPairs) + (long)pProgress[0xe].pFile);
    pProgress[2].nItemsNext = 0;
    Ssw_ClassesClearRefined((Ssw_Cla_t *)pProgress[1].pFile);
    pFVar1 = _stdout;
    if (*(int *)(*(long *)pProgress + 0x68) != 0) {
      iVar3 = Aig_ManObjNumMax((Aig_Man_t *)pProgress->pFile);
      pObj = (Aig_Obj_t *)Bar_ProgressStart(pFVar1,iVar3);
    }
    if ((*(int *)(*(long *)pProgress + 0x70) == 0) && (*(int *)(*(long *)pProgress + 0x74) == 0)) {
      local_c0 = (Vec_Int_t *)0x0;
    }
    else {
      local_c0 = Vec_IntAlloc(1000);
    }
    local_50 = local_c0;
    for (local_38 = 0; iVar3 = local_38,
        iVar4 = Vec_PtrSize((Vec_Ptr_t *)pProgress->pFile->_IO_write_base), iVar3 < iVar4;
        local_38 = local_38 + 1) {
      pObj2 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pProgress->pFile->_IO_write_base,local_38);
      if (pObj2 != (Aig_Obj_t *)0x0) {
        if (*(int *)(*(long *)pProgress + 0x68) != 0) {
          Bar_ProgressUpdate((Bar_Progress_t *)pObj,local_38,(char *)0x0);
        }
        iVar3 = Saig_ObjIsLo((Aig_Man_t *)pProgress->pFile,pObj2);
        if (iVar3 == 0) {
          iVar3 = Aig_ObjIsNode(pObj2);
          if (iVar3 != 0) {
            pAVar6 = *(Aig_Man_t **)(pProgress + 1);
            pAVar7 = Ssw_ObjChild0Fra((Ssw_Man_t *)pProgress,pObj2,clk._4_4_);
            pAVar8 = Ssw_ObjChild1Fra((Ssw_Man_t *)pProgress,pObj2,clk._4_4_);
            _i = Aig_And(pAVar6,pAVar7,pAVar8);
            Ssw_ObjSetFrame((Ssw_Man_t *)pProgress,pObj2,clk._4_4_,_i);
            uVar5 = Ssw_ManSweepNode((Ssw_Man_t *)pProgress,pObj2,clk._4_4_,0,local_50);
            pProgress[2].nItemsNext = uVar5 | pProgress[2].nItemsNext;
          }
        }
        else {
          uVar5 = Ssw_ManSweepNode((Ssw_Man_t *)pProgress,pObj2,clk._4_4_,0,local_50);
          pProgress[2].nItemsNext = uVar5 | pProgress[2].nItemsNext;
        }
      }
    }
    if (*(int *)(*(long *)pProgress + 0x68) != 0) {
      Bar_ProgressStop((Bar_Progress_t *)pObj);
    }
    iVar3 = Ssw_ManSweep::Counter;
    if (*(int *)(*(long *)pProgress + 0x70) != 0) {
      Ssw_ManSweep::Counter = Ssw_ManSweep::Counter + 1;
      Ssw_ManDumpEquivMiter((Aig_Man_t *)pProgress->pFile,local_50,iVar3,1);
    }
    if ((*(int *)(*(long *)pProgress + 0x74) != 0) && (pProgress[2].nItemsNext == 0)) {
      Ssw_ManDumpEquivMiter((Aig_Man_t *)pProgress->pFile,local_50,0,0);
    }
    Vec_IntFreeP(&local_50);
    return pProgress[2].nItemsNext;
  }
  __assert_fail("(nConstrPairs & 1) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSweep.c"
                ,0x184,"int Ssw_ManSweep(Ssw_Man_t *)");
}

Assistant:

int Ssw_ManSweep( Ssw_Man_t * p )
{
    static int Counter;
    Bar_Progress_t * pProgress = NULL;
    Aig_Obj_t * pObj, * pObj2, * pObjNew;
    int nConstrPairs, i, f;
    abctime clk;
    Vec_Int_t * vObjPairs;

    // perform speculative reduction
clk = Abc_Clock();
    // create timeframes
    p->pFrames = Ssw_FramesWithClasses( p );
    // add constants
    nConstrPairs = Aig_ManCoNum(p->pFrames)-Aig_ManRegNum(p->pAig);
    assert( (nConstrPairs & 1) == 0 );
    for ( i = 0; i < nConstrPairs; i += 2 )
    {
        pObj  = Aig_ManCo( p->pFrames, i   );
        pObj2 = Aig_ManCo( p->pFrames, i+1 );
        Ssw_NodesAreConstrained( p, Aig_ObjChild0(pObj), Aig_ObjChild0(pObj2) );
    }
    // build logic cones for register inputs
    for ( i = 0; i < Aig_ManRegNum(p->pAig); i++ )
    {
        pObj  = Aig_ManCo( p->pFrames, nConstrPairs + i );
        Ssw_CnfNodeAddToSolver( p->pMSat, Aig_ObjFanin0(pObj) );//
    }
    sat_solver_simplify( p->pMSat->pSat );

    // map constants and PIs of the last frame
    f = p->pPars->nFramesK;
    Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(p->pFrames) );
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, f, Aig_ObjCreateCi(p->pFrames) );
p->timeReduce += Abc_Clock() - clk;

    // sweep internal nodes
    p->fRefined = 0;
    Ssw_ClassesClearRefined( p->ppClasses );
    if ( p->pPars->fVerbose )
        pProgress = Bar_ProgressStart( stdout, Aig_ManObjNumMax(p->pAig) );
    vObjPairs = (p->pPars->fEquivDump || p->pPars->fEquivDump2)? Vec_IntAlloc(1000) : NULL;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( p->pPars->fVerbose )
            Bar_ProgressUpdate( pProgress, i, NULL );
        if ( Saig_ObjIsLo(p->pAig, pObj) )
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        else if ( Aig_ObjIsNode(pObj) )
        {
            pObjNew = Aig_And( p->pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            p->fRefined |= Ssw_ManSweepNode( p, pObj, f, 0, vObjPairs );
        }
    }
    if ( p->pPars->fVerbose )
        Bar_ProgressStop( pProgress );

    // cleanup
//    Ssw_ClassesCheck( p->ppClasses );
    if ( p->pPars->fEquivDump )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, Counter++, 1 );
    if ( p->pPars->fEquivDump2 && !p->fRefined )
        Ssw_ManDumpEquivMiter( p->pAig, vObjPairs, 0, 0 );
    Vec_IntFreeP( &vObjPairs );
    return p->fRefined;
}